

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O3

pair<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_bool> __thiscall
eastl::
vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>::
insert(vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>
       *this,value_type *val)

{
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar1;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar2;
  value_type *__src;
  uint uVar3;
  value_type *__dest;
  value_type *pvVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  ulong uVar8;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *position;
  size_t __n;
  pair<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_bool> pVar9;
  
  ppVar1 = (this->m_base).
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           .mpBegin;
  ppVar2 = (this->m_base).
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           .mpEnd;
  position = ppVar1;
  if (0 < (long)ppVar2 - (long)ppVar1) {
    uVar8 = ((ulong)((long)ppVar2 - (long)ppVar1) >> 3) * -0x3333333333333333;
    do {
      uVar5 = uVar8 >> 1;
      uVar6 = uVar5;
      if (position[uVar5].first < val->first) {
        uVar6 = ~uVar5 + uVar8;
        position = position + uVar5 + 1;
      }
      uVar8 = uVar6;
    } while (0 < (long)uVar6);
  }
  if (position == ppVar2) {
    if (ppVar2 == (this->m_base).
                  super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                  .mpCapacity) goto LAB_0010471f;
    (this->m_base).
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    .mpEnd = ppVar2 + 1;
    ppVar2->first = val->first;
    (ppVar2->second).mpBegin = (value_type *)0x0;
    (ppVar2->second).mpEnd = (value_type *)0x0;
    (ppVar2->second).mpCapacity = (value_type *)0x0;
    __src = (val->second).mpBegin;
    __n = (long)(val->second).mpEnd - (long)__src;
    uVar3 = (int)__n + 1;
    if (uVar3 < 2) {
      __dest = &gEmptyString;
      pvVar4 = &DAT_0010908d;
    }
    else {
      __dest = (value_type *)malloc((ulong)uVar3);
      pvVar4 = __dest + uVar3;
    }
    (ppVar2->second).mpBegin = __dest;
    (ppVar2->second).mpEnd = __dest;
    (ppVar2->second).mpCapacity = pvVar4;
    memmove(__dest,__src,__n);
    (ppVar2->second).mpEnd = __dest + __n;
    __dest[__n] = '\0';
    uVar7 = extraout_RDX_00;
  }
  else {
    if (position->first <= val->first) {
      uVar7 = 0;
      goto LAB_00104768;
    }
LAB_0010471f:
    vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>::
    DoInsertValue(&this->m_base,position,val);
    uVar7 = extraout_RDX;
  }
  position = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)
             ((long)position +
             ((long)(this->m_base).
                    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                    .mpBegin - (long)ppVar1));
  uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
LAB_00104768:
  pVar9._8_8_ = uVar7;
  pVar9.first = position;
  return pVar9;
}

Assistant:

::eastl::pair<iterator, bool> insert(value_type const& val) {
    iterator const i(lower_bound(val.first));

    return (i == end() || m_cmp(val.first, i->first))
        ? ::eastl::make_pair(m_base.insert(i, val), true)
        : ::eastl::make_pair(i, false)
        ;
  }